

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcpal.c
# Opt level: O2

FT_Error tt_face_load_cpal(TT_Face face,FT_Stream stream)

{
  byte bVar1;
  uint uVar2;
  FT_Memory memory;
  FT_Byte *pFVar3;
  ushort uVar4;
  FT_Error FVar5;
  ushort *P;
  FT_UShort *pFVar6;
  FT_Color *pFVar7;
  ulong uVar8;
  ulong uVar9;
  ushort uVar10;
  ulong uVar11;
  ushort uVar12;
  long lVar13;
  ushort uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  FT_Error error;
  FT_Byte *table;
  ulong local_90;
  ulong local_88;
  FT_ULong table_size;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  memory = (face->root).memory;
  table = (FT_Byte *)0x0;
  error = (*face->goto_table)(face,0x4350414c,stream,&table_size);
  if (error == 0) {
    if (table_size < 0xc) {
      P = (ushort *)0x0;
      goto LAB_002079c0;
    }
    error = FT_Stream_ExtractFrame(stream,table_size,&table);
    pFVar3 = table;
    if (error == 0) {
      P = (ushort *)ft_mem_alloc(memory,0x28,&error);
      if (error != 0) goto LAB_002079c8;
      uVar12 = *(ushort *)pFVar3 << 8 | *(ushort *)pFVar3 >> 8;
      *P = uVar12;
      if (uVar12 < 2) {
        uVar10 = *(ushort *)(pFVar3 + 2) << 8 | *(ushort *)(pFVar3 + 2) >> 8;
        (face->palette_data).num_palette_entries = uVar10;
        uVar4 = *(ushort *)(pFVar3 + 4) << 8 | *(ushort *)(pFVar3 + 4) >> 8;
        (face->palette_data).num_palettes = uVar4;
        uVar14 = *(ushort *)(pFVar3 + 6) << 8 | *(ushort *)(pFVar3 + 6) >> 8;
        P[1] = uVar14;
        if ((ulong)uVar4 * 2 + 0xc <= table_size) {
          uVar2 = *(uint *)(pFVar3 + 8);
          uVar11 = (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                          uVar2 << 0x18);
          if (((uVar11 < table_size) && ((ulong)uVar14 << 2 <= table_size - uVar11)) &&
             (uVar10 <= uVar14)) {
            *(FT_Byte **)(P + 8) = pFVar3 + 0xc;
            *(FT_Byte **)(P + 4) = table + uVar11;
            if (uVar12 != 1) goto LAB_00207dcb;
            if ((uint)uVar4 * 2 + 0x18 <= table_size) {
              uVar8 = (ulong)((uint)uVar4 * 2);
              local_40 = (ulong)(pFVar3 + 0xc)[uVar8] * 0x1000000;
              local_48 = (ulong)pFVar3[uVar8 + 0xd] * 0x10000;
              bVar1 = pFVar3[uVar8 + 0xe];
              local_50 = (ulong)pFVar3[uVar8 + 0xf];
              local_60 = (ulong)pFVar3[uVar8 + 0x10];
              local_68 = (ulong)pFVar3[uVar8 + 0x11];
              local_38 = (ulong)pFVar3[uVar8 + 0x12];
              local_58 = (ulong)pFVar3[uVar8 + 0x13];
              uVar15 = local_40 + local_48 | (ulong)bVar1 * 0x100 | local_50;
              uVar11 = (ulong)pFVar3[uVar8 + 0x17];
              uVar9 = (ulong)pFVar3[uVar8 + 0x14];
              uVar16 = (ulong)pFVar3[uVar8 + 0x16];
              uVar17 = (ulong)pFVar3[uVar8 + 0x15];
              if (uVar15 != 0) {
                if ((table_size <= uVar15) || (table_size - uVar15 < uVar8)) goto LAB_002079c0;
                local_90 = (ulong)pFVar3[uVar8 + 0x16];
                local_88 = (ulong)pFVar3[uVar8 + 0x17];
                local_78 = (ulong)pFVar3[uVar8 + 0x14];
                local_70 = (ulong)pFVar3[uVar8 + 0x15];
                pFVar6 = (FT_UShort *)ft_mem_qrealloc(memory,2,0,(ulong)uVar4,(void *)0x0,&error);
                if (error != 0) goto LAB_002079c8;
                uVar12 = (face->palette_data).num_palettes;
                for (lVar13 = 0; (FT_UShort *)((long)pFVar6 + lVar13) < pFVar6 + uVar12;
                    lVar13 = lVar13 + 2) {
                  *(FT_UShort *)((long)pFVar6 + lVar13) =
                       *(ushort *)
                        (table + lVar13 + (ulong)bVar1 * 0x100 + local_50 + local_40 + local_48) <<
                       8 | *(ushort *)
                            (table + lVar13 + (ulong)bVar1 * 0x100 + local_50 + local_40 + local_48)
                           >> 8;
                }
                (face->palette_data).palette_flags = pFVar6;
                uVar11 = local_88;
                uVar9 = local_78;
                uVar16 = local_90;
                uVar17 = local_70;
              }
              local_60 = (ulong)(uint)((int)local_60 << 0x18);
              uVar15 = (ulong)(uint)((int)local_68 << 0x10);
              uVar18 = (ulong)(uint)((int)local_38 << 8);
              uVar8 = (local_60 + uVar15 | uVar18) + local_58;
              if (uVar8 == 0) {
LAB_00207d11:
                uVar8 = (ulong)(uint)((int)uVar9 << 0x18);
                uVar17 = (ulong)(uint)((int)uVar17 << 0x10);
                uVar16 = (ulong)(uint)((int)uVar16 << 8);
                uVar9 = uVar17 + uVar8 | uVar16 | uVar11;
                if (uVar9 == 0) {
LAB_00207dcb:
                  *(FT_Byte **)(P + 0xc) = table;
                  *(FT_ULong *)(P + 0x10) = table_size;
                  face->cpal = P;
                  pFVar7 = (FT_Color *)
                           ft_mem_realloc(memory,4,0,(ulong)(face->palette_data).num_palette_entries
                                          ,(void *)0x0,&error);
                  face->palette = pFVar7;
                  if (error != 0) goto LAB_002079c8;
                  FVar5 = tt_face_palette_set(face,0);
                  if (FVar5 == 0) {
                    return 0;
                  }
                }
                else {
                  local_90 = uVar16;
                  local_88 = uVar11;
                  if (uVar9 < table_size) {
                    uVar12 = (face->palette_data).num_palette_entries;
                    if ((ulong)((uint)uVar12 + (uint)uVar12) <= table_size - uVar9) {
                      pFVar6 = (FT_UShort *)
                               ft_mem_qrealloc(memory,2,0,(ulong)uVar12,(void *)0x0,&error);
                      if (error != 0) goto LAB_002079c8;
                      uVar12 = (face->palette_data).num_palette_entries;
                      for (lVar13 = 0; (FT_UShort *)((long)pFVar6 + lVar13) < pFVar6 + uVar12;
                          lVar13 = lVar13 + 2) {
                        *(FT_UShort *)((long)pFVar6 + lVar13) =
                             *(ushort *)(table + lVar13 + uVar8 + uVar17 + local_90 + local_88) << 8
                             | *(ushort *)(table + lVar13 + uVar8 + uVar17 + local_90 + local_88) >>
                               8;
                      }
                      (face->palette_data).palette_entry_name_ids = pFVar6;
                      goto LAB_00207dcb;
                    }
                  }
                }
              }
              else if (uVar8 < table_size) {
                uVar12 = (face->palette_data).num_palettes;
                local_90 = uVar16;
                local_88 = uVar11;
                local_78 = uVar9;
                local_70 = uVar17;
                local_68 = uVar15;
                if ((ulong)((uint)uVar12 + (uint)uVar12) <= table_size - uVar8) {
                  pFVar6 = (FT_UShort *)ft_mem_qrealloc(memory,2,0,(ulong)uVar12,(void *)0x0,&error)
                  ;
                  if (error != 0) goto LAB_002079c8;
                  uVar12 = (face->palette_data).num_palettes;
                  for (lVar13 = 0; (FT_UShort *)((long)pFVar6 + lVar13) < pFVar6 + uVar12;
                      lVar13 = lVar13 + 2) {
                    *(FT_UShort *)((long)pFVar6 + lVar13) =
                         *(ushort *)(table + lVar13 + local_60 + local_68 + uVar18 + local_58) << 8
                         | *(ushort *)(table + lVar13 + local_60 + local_68 + uVar18 + local_58) >>
                           8;
                  }
                  (face->palette_data).palette_name_ids = pFVar6;
                  uVar11 = local_88;
                  uVar9 = local_78;
                  uVar16 = local_90;
                  uVar17 = local_70;
                  goto LAB_00207d11;
                }
              }
            }
          }
        }
      }
LAB_002079c0:
      error = 8;
      goto LAB_002079c8;
    }
  }
  P = (ushort *)0x0;
LAB_002079c8:
  FT_Stream_ReleaseFrame(stream,&table);
  ft_mem_free(memory,P);
  face->cpal = (void *)0x0;
  return error;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_cpal( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error   error;
    FT_Memory  memory = face->root.memory;

    FT_Byte*  table = NULL;
    FT_Byte*  p     = NULL;

    Cpal*  cpal = NULL;

    FT_ULong  colors_offset;
    FT_ULong  table_size;


    error = face->goto_table( face, TTAG_CPAL, stream, &table_size );
    if ( error )
      goto NoCpal;

    if ( table_size < CPAL_V0_HEADER_BASE_SIZE )
      goto InvalidTable;

    if ( FT_FRAME_EXTRACT( table_size, table ) )
      goto NoCpal;

    p = table;

    if ( FT_NEW( cpal ) )
      goto NoCpal;

    cpal->version = FT_NEXT_USHORT( p );
    if ( cpal->version > 1 )
      goto InvalidTable;

    face->palette_data.num_palette_entries = FT_NEXT_USHORT( p );
    face->palette_data.num_palettes        = FT_NEXT_USHORT( p );

    cpal->num_colors = FT_NEXT_USHORT( p );
    colors_offset    = FT_NEXT_ULONG( p );

    if ( CPAL_V0_HEADER_BASE_SIZE             +
         face->palette_data.num_palettes * 2U > table_size )
      goto InvalidTable;

    if ( colors_offset >= table_size )
      goto InvalidTable;
    if ( cpal->num_colors * COLOR_SIZE > table_size - colors_offset )
      goto InvalidTable;

    if ( face->palette_data.num_palette_entries > cpal->num_colors )
      goto InvalidTable;

    cpal->color_indices = p;
    cpal->colors        = (FT_Byte*)( table + colors_offset );

    if ( cpal->version == 1 )
    {
      FT_ULong    type_offset, label_offset, entry_label_offset;
      FT_UShort*  array = NULL;
      FT_UShort*  limit;
      FT_UShort*  q;


      if ( CPAL_V0_HEADER_BASE_SIZE             +
           face->palette_data.num_palettes * 2U +
           3U * 4                               > table_size )
        goto InvalidTable;

      p += face->palette_data.num_palettes * 2U;

      type_offset        = FT_NEXT_ULONG( p );
      label_offset       = FT_NEXT_ULONG( p );
      entry_label_offset = FT_NEXT_ULONG( p );

      if ( type_offset )
      {
        if ( type_offset >= table_size )
          goto InvalidTable;
        if ( face->palette_data.num_palettes * 2U >
               table_size - type_offset )
          goto InvalidTable;

        if ( FT_QNEW_ARRAY( array, face->palette_data.num_palettes ) )
          goto NoCpal;

        p     = table + type_offset;
        q     = array;
        limit = q + face->palette_data.num_palettes;

        while ( q < limit )
          *q++ = FT_NEXT_USHORT( p );

        face->palette_data.palette_flags = array;
      }

      if ( label_offset )
      {
        if ( label_offset >= table_size )
          goto InvalidTable;
        if ( face->palette_data.num_palettes * 2U >
               table_size - label_offset )
          goto InvalidTable;

        if ( FT_QNEW_ARRAY( array, face->palette_data.num_palettes ) )
          goto NoCpal;

        p     = table + label_offset;
        q     = array;
        limit = q + face->palette_data.num_palettes;

        while ( q < limit )
          *q++ = FT_NEXT_USHORT( p );

        face->palette_data.palette_name_ids = array;
      }

      if ( entry_label_offset )
      {
        if ( entry_label_offset >= table_size )
          goto InvalidTable;
        if ( face->palette_data.num_palette_entries * 2U >
               table_size - entry_label_offset )
          goto InvalidTable;

        if ( FT_QNEW_ARRAY( array, face->palette_data.num_palette_entries ) )
          goto NoCpal;

        p     = table + entry_label_offset;
        q     = array;
        limit = q + face->palette_data.num_palette_entries;

        while ( q < limit )
          *q++ = FT_NEXT_USHORT( p );

        face->palette_data.palette_entry_name_ids = array;
      }
    }

    cpal->table      = table;
    cpal->table_size = table_size;

    face->cpal = cpal;

    /* set up default palette */
    if ( FT_NEW_ARRAY( face->palette,
                       face->palette_data.num_palette_entries ) )
      goto NoCpal;

    if ( tt_face_palette_set( face, 0 ) )
      goto InvalidTable;

    return FT_Err_Ok;

  InvalidTable:
    error = FT_THROW( Invalid_Table );

  NoCpal:
    FT_FRAME_RELEASE( table );
    FT_FREE( cpal );

    face->cpal = NULL;

    /* arrays in `face->palette_data' and `face->palette' */
    /* are freed in `sfnt_done_face'                      */

    return error;
  }